

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O1

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
llvm::MemoryBuffer::getMemBufferCopy(StringRef InputData,Twine *BufferName)

{
  Twine *in_RCX;
  undefined8 uVar1;
  pointer *__ptr;
  __uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true> _Var2;
  StringRef InputData_00;
  ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
  Buf;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>_2
  local_28;
  byte local_18;
  
  InputData_00.Data = (char *)InputData.Length;
  _Var2.super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
  super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
  super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl =
       (__uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>)InputData.Data
  ;
  InputData_00.Length = (size_t)BufferName;
  getMemBufferCopyImpl
            ((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
              *)&local_28.TStorage,InputData_00,in_RCX);
  uVar1 = local_28.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer;
  if ((local_18 & 1) == 0) {
    local_28.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
         (AlignedCharArrayUnion<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
          )(AlignedCharArray<8UL,_8UL>)0x0;
  }
  else {
    *(undefined8 *)
     _Var2.super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
     super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
     super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl = 0;
    uVar1._0_1_ = '\0';
    uVar1._1_1_ = '\0';
    uVar1._2_1_ = '\0';
    uVar1._3_1_ = '\0';
    uVar1._4_1_ = '\0';
    uVar1._5_1_ = '\0';
    uVar1._6_1_ = '\0';
    uVar1._7_1_ = '\0';
  }
  *(undefined8 *)
   _Var2.super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
   super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
   super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl = uVar1;
  if (((local_18 & 1) == 0) &&
     ((AlignedCharArray<8UL,_8UL>)local_28.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer !=
      (AlignedCharArray<8UL,_8UL>)0x0)) {
    (**(code **)(*(long *)local_28.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer + 8))();
  }
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (tuple<llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>)
         _Var2.super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>.
         _M_t.super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>
         .super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<MemoryBuffer>
MemoryBuffer::getMemBufferCopy(StringRef InputData, const Twine &BufferName) {
  auto Buf = getMemBufferCopyImpl(InputData, BufferName);
  if (Buf)
    return std::move(*Buf);
  return nullptr;
}